

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O2

int cvLsJacTimesVecBWrapper
              (N_Vector vB,N_Vector JvB,sunrealtype t,N_Vector yB,N_Vector fyB,void *cvode_mem,
              N_Vector tmpB)

{
  int iVar1;
  CVLsMemB cvlsB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  
  iVar1 = cvLs_AccessLMemBCur(cvode_mem,"cvLsJacTimesVecBWrapper",&cv_mem,&ca_mem,&cvB_mem,
                              &cvlsB_mem);
  if (iVar1 == 0) {
    iVar1 = (*ca_mem->ca_IMget)(cv_mem,t,ca_mem->ca_ytmp,(N_Vector *)0x0);
    if (iVar1 == 0) {
      iVar1 = (*cvlsB_mem->jtimesB)(vB,JvB,t,ca_mem->ca_ytmp,yB,fyB,cvB_mem->cv_user_data,tmpB);
    }
    else {
      iVar1 = -1;
      cvProcessError(cv_mem,-1,0xa88,"cvLsJacTimesVecBWrapper",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                     ,"Bad t for interpolation.");
    }
  }
  return iVar1;
}

Assistant:

static int cvLsJacTimesVecBWrapper(N_Vector vB, N_Vector JvB, sunrealtype t,
                                   N_Vector yB, N_Vector fyB, void* cvode_mem,
                                   N_Vector tmpB)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVLsMemB cvlsB_mem;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemBCur(cvode_mem, "cvLsJacTimesVecBWrapper", &cv_mem,
                               &ca_mem, &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Forward solution from interpolation */
  retval = ca_mem->ca_IMget(cv_mem, t, ca_mem->ca_ytmp, NULL);
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSG_LS_BAD_TINTERP);
    return (-1);
  }

  /* Call user's adjoint jtimesB routine */
  return (cvlsB_mem->jtimesB(vB, JvB, t, ca_mem->ca_ytmp, yB, fyB,
                             cvB_mem->cv_user_data, tmpB));
}